

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined8 *__s;
  void *pvVar3;
  long lVar4;
  void *__s_00;
  ostream *poVar5;
  pointer pvVar6;
  int j;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int i;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  ofstream file;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_248;
  value_type local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (undefined8 *)operator_new(0xc0);
  memset(__s,0,0xc0);
  pvVar3 = operator_new(0xc0);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)pvVar3 + lVar4) = 0x4069000000000000;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xc0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_248,0x18);
  lVar4 = 0;
  do {
    local_230 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((local_248.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar4),0x18,&local_230);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x240);
  uVar8 = 0;
  pvVar6 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar7 = (uint)uVar8;
    iVar10 = uVar7 + (int)((uVar8 & 0xffffffff) / 6) * -6;
    if (((iVar10 != 0) && (iVar10 != 5)) &&
       ((0x17 < uVar7 || ((0xfc003fU >> (uVar7 & 0x1f) & 1) == 0)))) {
      pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1[uVar8 - 1] = 0.25;
      pdVar1[uVar8 + 1] = 0.25;
      pdVar1[uVar8 - 6] = 0.25;
      pdVar1[uVar8 + 6] = 0.25;
    }
    uVar8 = uVar8 + 1;
    pvVar6 = pvVar6 + 1;
  } while (uVar8 != 0x18);
  pdVar1 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xb].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1[5] = 0.24141630919814847;
  pdVar1[0x11] = 0.24141630919814847;
  pdVar1[10] = 0.48283261839629693;
  __s[0xb] = 0x3feb77c26ee95ecb;
  pdVar2 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x11].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2[0xb] = pdVar1[5];
  pdVar2[0x17] = pdVar1[0x11];
  pdVar2[0x10] = pdVar1[10];
  __s[0x11] = __s[0xb];
  pdVar1 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *pdVar1 = 0.25;
  pdVar1[0xc] = 0.25;
  pdVar1[7] = 0.5;
  pdVar1 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1[6] = 0.25;
  pdVar1[0x12] = 0.25;
  pdVar1[0xd] = 0.5;
  *__s = 0x4069000000000000;
  __s[1] = 0x4069000000000000;
  __s[2] = 0x4069000000000000;
  __s[3] = 0x4069000000000000;
  __s[4] = 0x4069000000000000;
  __s[5] = 0x4069000000000000;
  pvVar6 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 0x13;
  lVar4 = 0x14;
  do {
    pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[lVar4 + -7] = 0.5;
    pdVar1[lVar4 + -2] = 0.25;
    pdVar1[lVar4] = 0.25;
    __s[lVar4 + -1] = 0x3ff555554d555555;
    pvVar6 = pvVar6 + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x18);
  pdVar1 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x12].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1[0xc] = 0.5;
  pdVar1[0x13] = 0.5;
  __s[0x12] = 0x3ff555554d555555;
  pdVar1 = local_248.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x17].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1[0x16] = 0.48283261839629693;
  pdVar1[0x11] = 0.48283261839629693;
  __s[0x17] = 0x40012ad98551db3f;
  __s_00 = operator_new(0xc0);
  lVar4 = 0;
  memset(__s_00,0,0xc0);
  dVar11 = 0.0;
  do {
    do {
      dVar12 = *(double *)((long)pvVar3 + lVar4 * 8);
      *(double *)((long)__s_00 + lVar4 * 8) = dVar12;
      *(undefined8 *)((long)pvVar3 + lVar4 * 8) = 0;
      pdVar1 = local_248.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar4].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar9 = 0;
      dVar13 = 0.0;
      do {
        dVar13 = dVar13 + pdVar1[lVar9] * *(double *)((long)__s_00 + lVar9 * 8);
        *(double *)((long)pvVar3 + lVar4 * 8) = dVar13;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x18);
      dVar13 = (double)__s[lVar4] + *(double *)((long)pvVar3 + lVar4 * 8);
      *(double *)((long)pvVar3 + lVar4 * 8) = dVar13;
      dVar12 = ABS(dVar12 - dVar13);
      if (dVar12 <= dVar11) {
        dVar12 = dVar11;
      }
      lVar4 = lVar4 + 1;
      dVar11 = dVar12;
    } while (lVar4 != 0x18);
    lVar4 = 0;
    dVar11 = 0.0;
  } while (0.0001 < dVar12);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x102028);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# X Y Z\n",8);
  iVar10 = 0;
  uVar8 = 0;
  do {
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&local_230,iVar10 + (int)((uVar8 & 0xffffffff) / 6) * -0x1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)((uVar8 & 0xffffffff) / 6) * 0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<double>(*(double *)((long)pvVar3 + uVar8 * 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    uVar8 = uVar8 + 1;
    iVar10 = iVar10 + 0x50;
  } while (uVar8 != 0x18);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)((long)_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  operator_delete(__s_00);
  operator_delete(pvVar3);
  operator_delete(__s);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_248);
  return 0;
}

Assistant:

int main(){
  double dx = 0.08f, dy = 0.08f;
  double h = 40.0f, t_f = 25.0f, lambda = 45.0f, q_w = 1500;

  std::vector<std::vector<double> > A;
  std::vector<double> c(24,0);
  std::vector<double> t(24,200);
  A.resize(24);
  for (int i=0;i<24;i++){
    A[i].resize(24,0);
  }

  // Inner points
  for (int i=0;i<24;i++){
    if ((i%6 == 0) || (i%6 == 5)) continue;
    if ((i/6 == 0) || (i/6 == 3)) continue;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    A[i][i-6] = 0.25f;
    A[i][i+6] = 0.25f;
  }

  // Convection
  double two_h_x_l = 2.0f * h * dx / lambda;
  A[11][5] = 1.0f / (4.0f + two_h_x_l);
  A[11][17] = A[11][5];
  A[11][10] = 2 * A[11][5];
  c[11] = two_h_x_l / (4.0f + two_h_x_l) * t_f;
  A[17][11] = A[11][5];
  A[17][23] = A[11][17];
  A[17][16] = A[11][10];
  c[17] = c[11];

  // Insulation
  A[6][0] = 0.25f;
  A[6][12] = 0.25f;
  A[6][7] = 0.5f;
  A[12][6] = 0.25f;
  A[12][18] = 0.25f;
  A[12][13] = 0.5f;

  // I
  c[0] = 200.0f;
  c[1] = 200.0f;
  c[2] = 200.0f;
  c[3] = 200.0f;
  c[4] = 200.0f;
  c[5] = 200.0f;

  // II
  double temp = dx * q_w / lambda / 2;
  for (int i=19;i<23;i++){
    A[i][i-6] = 0.5f;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    c[i] = temp;
  }

  // half II + half iso
  A[18][12] = 0.5f;
  A[18][19] = 0.5f;
  c[18] = q_w * dx / lambda / 2;

  // half II + half III
  A[23][22] = 1.0f / (2.0 + h * dx / lambda);
  A[23][17] = A[23][22];
  c[23] = (q_w * dx / lambda + h * dx * t_f / lambda) / (2.0 + h * dx / lambda);


  // Gaussian Seidel Method
  std::vector<double> x_aux(24,0);
  double error;

  do {
    error = 0;
    for (int i=0;i<24;i++){
      x_aux[i] = t[i];
      t[i] = 0;
      for (int j=0;j<24;j++){
        t[i] += A[i][j] * x_aux[j];
      }
      t[i] += c[i];
      double temp = std::abs(x_aux[i] - t[i]);
      if (temp > error)
        error = temp;
    }
  } while (error>0.0001);

//  for (int i=0;i<24;i++){
//    std::cout<<t[i]<<" ";
//    if (i%6 == 5) std::cout<<std::endl;
//  }

  // To file
  std::ofstream file;
  file.open("data.dat");
  file<<"# X Y Z\n";
  for (int i=0;i<24;i++){
    file << i%6 * 80 << " " << i/6 * 80 << " " << t[i] << "\n";
  }
  file.close();

  return 0;
}